

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode Curl_senddata(Curl_easy *data,void *buffer,size_t buflen,size_t *n)

{
  undefined1 local_e0 [8];
  sigpipe_ignore pipe_st;
  connectdata *c;
  CURLcode result;
  size_t *n_local;
  size_t buflen_local;
  void *buffer_local;
  Curl_easy *data_local;
  
  pipe_st.no_signal = false;
  pipe_st._153_7_ = 0;
  *n = 0;
  data_local._4_4_ = easy_connection(data,(connectdata **)&pipe_st.no_signal);
  if (data_local._4_4_ == CURLE_OK) {
    if (data->conn == (connectdata *)0x0) {
      Curl_attach_connection(data,(connectdata *)pipe_st._152_8_);
    }
    sigpipe_ignore(data,(sigpipe_ignore *)local_e0);
    data_local._4_4_ = Curl_conn_send(data,0,buffer,buflen,false,n);
    sigpipe_restore((sigpipe_ignore *)local_e0);
    if ((data_local._4_4_ != CURLE_OK) && (data_local._4_4_ != CURLE_AGAIN)) {
      data_local._4_4_ = CURLE_SEND_ERROR;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_senddata(struct Curl_easy *data, const void *buffer,
                       size_t buflen, size_t *n)
{
  CURLcode result;
  struct connectdata *c = NULL;
  SIGPIPE_VARIABLE(pipe_st);

  *n = 0;
  result = easy_connection(data, &c);
  if(result)
    return result;

  if(!data->conn)
    /* on first invoke, the transfer has been detached from the connection and
       needs to be reattached */
    Curl_attach_connection(data, c);

  sigpipe_ignore(data, &pipe_st);
  result = Curl_conn_send(data, FIRSTSOCKET, buffer, buflen, FALSE, n);
  sigpipe_restore(&pipe_st);

  if(result && result != CURLE_AGAIN)
    return CURLE_SEND_ERROR;
  return result;
}